

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall iutest::detail::IParamTestInfoData::~IParamTestInfoData(IParamTestInfoData *this)

{
  this->_vptr_IParamTestInfoData = (_func_int **)&PTR__IParamTestInfoData_00139468;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

const char* GetName() const { return m_name.c_str(); }